

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::ArenaTest_SpaceAllocated_and_Used_Test::TestBody
          (ArenaTest_SpaceAllocated_and_Used_Test *this)

{
  void *__s;
  value_type *__val;
  char *pcVar1;
  AllocationPolicy res;
  Arena arena_2;
  Arena arena_1;
  AssertHelper local_190;
  AssertHelper local_188;
  undefined1 local_180 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  _func_void_ptr_size_t *local_170;
  _func_void_void_ptr_size_t *p_Stack_168;
  undefined1 local_160 [8];
  TaggedAllocationPolicyPtr local_158;
  ThreadSafeArena local_b8;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_b8);
  local_190.data_ = (AssertHelperData *)((ulong)local_190.data_._4_4_ << 0x20);
  local_180 = (undefined1  [8])protobuf::internal::ThreadSafeArena::SpaceAllocated(&local_b8);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_160,"0","arena_1.SpaceAllocated()",(int *)&local_190,
             (unsigned_long *)local_180);
  if (local_160[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_180);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158.policy_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = *(char **)local_158.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x672,pcVar1);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_180 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_180 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158.policy_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_158.policy_);
  }
  local_190.data_ = local_190.data_ & 0xffffffff00000000;
  local_180 = (undefined1  [8])protobuf::internal::ThreadSafeArena::SpaceUsed(&local_b8);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_160,"0","arena_1.SpaceUsed()",(int *)&local_190,
             (unsigned_long *)local_180);
  if (local_160[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_180);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158.policy_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = *(char **)local_158.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x673,pcVar1);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_180 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_180 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158.policy_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_158.policy_);
  }
  local_190.data_ = local_190.data_ & 0xffffffff00000000;
  local_180 = (undefined1  [8])protobuf::internal::ThreadSafeArena::Reset(&local_b8);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_160,"0","arena_1.Reset()",(int *)&local_190,
             (unsigned_long *)local_180);
  if (local_160[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_180);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158.policy_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = *(char **)local_158.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x674,pcVar1);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_180 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_180 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158.policy_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_158.policy_);
  }
  Arena::AllocateForArray((Arena *)&local_b8,0x140);
  local_190.data_._0_4_ = 0x140;
  local_180 = (undefined1  [8])protobuf::internal::ThreadSafeArena::SpaceAllocated(&local_b8);
  testing::internal::CmpHelperLE<int,unsigned_long>
            ((internal *)local_160,"320","arena_1.SpaceAllocated()",(int *)&local_190,
             (unsigned_long *)local_180);
  if (local_160[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_180);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158.policy_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = *(char **)local_158.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x677,pcVar1);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_180 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_180 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158.policy_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_158.policy_);
  }
  local_180 = (undefined1  [8])0x140;
  local_190.data_ = (AssertHelperData *)protobuf::internal::ThreadSafeArena::SpaceUsed(&local_b8);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_160,"Align8(320)","arena_1.SpaceUsed()",(unsigned_long *)local_180,
             (unsigned_long *)&local_190);
  if (local_160[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_180);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158.policy_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = *(char **)local_158.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x678,pcVar1);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_180 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_180 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158.policy_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_158.policy_);
  }
  local_190.data_._0_4_ = 0x140;
  local_180 = (undefined1  [8])protobuf::internal::ThreadSafeArena::Reset(&local_b8);
  testing::internal::CmpHelperLE<int,unsigned_long>
            ((internal *)local_160,"320","arena_1.Reset()",(int *)&local_190,
             (unsigned_long *)local_180);
  if (local_160[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_180);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158.policy_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = *(char **)local_158.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x679,pcVar1);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_180 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_180 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158.policy_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_158.policy_);
  }
  __s = operator_new(0x400);
  memset(__s,0,0x400);
  local_180 = (undefined1  [8])0x100;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00002000;
  local_170 = (_func_void_ptr_size_t *)0x0;
  p_Stack_168 = (_func_void_void_ptr_size_t *)0x0;
  protobuf::internal::ThreadSafeArena::ThreadSafeArena
            ((ThreadSafeArena *)local_160,__s,0x400,(AllocationPolicy *)local_180);
  local_188.data_._0_4_ = 0x400;
  local_190.data_ =
       (AssertHelperData *)
       protobuf::internal::ThreadSafeArena::SpaceAllocated((ThreadSafeArena *)local_160);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_180,"1024","arena_2.SpaceAllocated()",(int *)&local_188,
             (unsigned_long *)&local_190);
  if (local_180[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_190);
    if (local_178 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_178->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x683,pcVar1);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if (local_190.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_190.data_ + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  local_188.data_ = local_188.data_ & 0xffffffff00000000;
  local_190.data_ =
       (AssertHelperData *)
       protobuf::internal::ThreadSafeArena::SpaceUsed((ThreadSafeArena *)local_160);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_180,"0","arena_2.SpaceUsed()",(int *)&local_188,
             (unsigned_long *)&local_190);
  if (local_180[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_190);
    if (local_178 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_178->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x684,pcVar1);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if (local_190.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_190.data_ + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  local_188.data_._0_4_ = 0x400;
  local_190.data_ =
       (AssertHelperData *)protobuf::internal::ThreadSafeArena::Reset((ThreadSafeArena *)local_160);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_180,"1024","arena_2.Reset()",(int *)&local_188,
             (unsigned_long *)&local_190);
  if (local_180[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_190);
    if (local_178 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_178->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x685,pcVar1);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if (local_190.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_190.data_ + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  Arena::AllocateForArray((Arena *)local_160,0x38);
  local_188.data_._0_4_ = 0x400;
  local_190.data_ =
       (AssertHelperData *)
       protobuf::internal::ThreadSafeArena::SpaceAllocated((ThreadSafeArena *)local_160);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_180,"1024","arena_2.SpaceAllocated()",(int *)&local_188,
             (unsigned_long *)&local_190);
  if (local_180[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_190);
    if (local_178 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_178->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x687,pcVar1);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if (local_190.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_190.data_ + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  local_190.data_ = (AssertHelperData *)&DAT_00000038;
  local_188.data_ =
       (AssertHelperData *)
       protobuf::internal::ThreadSafeArena::SpaceUsed((ThreadSafeArena *)local_160);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_180,"Align8(55)","arena_2.SpaceUsed()",(unsigned_long *)&local_190,
             (unsigned_long *)&local_188);
  if (local_180[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_190);
    if (local_178 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_178->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x688,pcVar1);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if (local_190.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_190.data_ + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  local_188.data_._0_4_ = 0x400;
  local_190.data_ =
       (AssertHelperData *)protobuf::internal::ThreadSafeArena::Reset((ThreadSafeArena *)local_160);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_180,"1024","arena_2.Reset()",(int *)&local_188,
             (unsigned_long *)&local_190);
  if (local_180[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_190);
    if (local_178 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_178->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x689,pcVar1);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if (local_190.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_190.data_ + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena((ThreadSafeArena *)local_160);
  operator_delete(__s,0x400);
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_b8);
  return;
}

Assistant:

TEST(ArenaTest, SpaceAllocated_and_Used) {
  Arena arena_1;
  EXPECT_EQ(0, arena_1.SpaceAllocated());
  EXPECT_EQ(0, arena_1.SpaceUsed());
  EXPECT_EQ(0, arena_1.Reset());
  Arena::CreateArray<char>(&arena_1, 320);
  // Arena will allocate slightly more than 320 for the block headers.
  EXPECT_LE(320, arena_1.SpaceAllocated());
  EXPECT_EQ(Align8(320), arena_1.SpaceUsed());
  EXPECT_LE(320, arena_1.Reset());

  // Test with initial block.
  std::vector<char> arena_block(1024);
  ArenaOptions options;
  options.start_block_size = 256;
  options.max_block_size = 8192;
  options.initial_block = &arena_block[0];
  options.initial_block_size = arena_block.size();
  Arena arena_2(options);
  EXPECT_EQ(1024, arena_2.SpaceAllocated());
  EXPECT_EQ(0, arena_2.SpaceUsed());
  EXPECT_EQ(1024, arena_2.Reset());
  Arena::CreateArray<char>(&arena_2, 55);
  EXPECT_EQ(1024, arena_2.SpaceAllocated());
  EXPECT_EQ(Align8(55), arena_2.SpaceUsed());
  EXPECT_EQ(1024, arena_2.Reset());
}